

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http(Curl_easy *data,_Bool *done)

{
  connectdata *conn;
  uchar uVar1;
  char cVar2;
  byte bVar3;
  _Bool _Var4;
  CURLcode CVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  bool bVar17;
  char *in_stack_ffffffffffffff48;
  Curl_HttpReq httpreq;
  char *local_a8;
  Curl_HttpReq local_a0;
  uint local_9c;
  dynbuf req;
  char *request;
  char *te;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  conn = data->conn;
  te = "";
  *done = true;
  if ((((conn->alpn == '\x03') && (uVar1 = Curl_conn_http_version(data,conn), uVar1 != '\x14')) &&
      (CVar5 = CURLE_UNSUPPORTED_PROTOCOL, ((ulong)conn->bits & 0x18) == 0x10)) ||
     (CVar5 = Curl_headers_init(data), CVar5 != CURLE_OK)) goto LAB_00135a52;
  if (((data->state).field_0x7be & 8) == 0) {
    (*Curl_cfree)((data->state).first_host);
    pcVar7 = (*Curl_cstrdup)((conn->host).name);
    (data->state).first_host = pcVar7;
    if (pcVar7 != (char *)0x0) {
      (data->state).first_remote_port = conn->remote_port;
      (data->state).first_remote_protocol = conn->handler->protocol;
      goto LAB_00135291;
    }
LAB_001353d4:
    CVar5 = CURLE_OUT_OF_MEMORY;
    bVar17 = false;
  }
  else {
LAB_00135291:
    (*Curl_cfree)((data->state).aptr.host);
    (data->state).aptr.host = (char *)0x0;
    pcVar7 = Curl_checkheaders(data,"Host",4);
    if ((pcVar7 == (char *)0x0) ||
       ((((data->state).field_0x7be & 8) != 0 &&
        (iVar6 = curl_strequal((data->state).first_host,(conn->host).name), iVar6 == 0)))) {
      pcVar7 = (conn->host).name;
      uVar11 = conn->given->protocol;
      if ((((uVar11 & 0x80000002) == 0) || (conn->remote_port != 0x1bb)) &&
         (((uVar11 & 0x40000001) == 0 || (conn->remote_port != 0x50)))) {
        bVar17 = (*(uint *)&conn->bits >> 10 & 1) == 0;
        pcVar8 = "[";
        if (bVar17) {
          pcVar8 = "";
        }
        pcVar12 = "]";
        if (bVar17) {
          pcVar12 = "";
        }
        pcVar7 = curl_maprintf("Host: %s%s%s:%d\r\n",pcVar8,pcVar7,pcVar12,
                               (ulong)(uint)conn->remote_port);
      }
      else {
        bVar17 = (*(uint *)&conn->bits >> 10 & 1) == 0;
        pcVar8 = "[";
        if (bVar17) {
          pcVar8 = "";
        }
        pcVar12 = "]";
        if (bVar17) {
          pcVar12 = "";
        }
        pcVar7 = curl_maprintf("Host: %s%s%s\r\n",pcVar8,pcVar7,pcVar12);
      }
      (data->state).aptr.host = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_001353d4;
    }
    else {
      pcVar8 = Curl_copy_header_value(in_stack_ffffffffffffff48);
      CVar5 = CURLE_OUT_OF_MEMORY;
      if (pcVar8 == (char *)0x0) goto LAB_001353d4;
      if (*pcVar8 == '[') {
        sVar9 = strlen(pcVar8);
        memmove(pcVar8,pcVar8 + 1,sVar9 - 1);
        iVar6 = 0x5d;
LAB_00135411:
        pcVar12 = strchr(pcVar8,iVar6);
        if (pcVar12 != (char *)0x0) {
          *pcVar12 = '\0';
        }
        (*Curl_cfree)((data->state).aptr.cookiehost);
        (data->state).aptr.cookiehost = pcVar8;
      }
      else {
        if (*pcVar8 != '\0') {
          iVar6 = 0x3a;
          goto LAB_00135411;
        }
        (*Curl_cfree)(pcVar8);
      }
      iVar6 = curl_strequal("Host:",pcVar7);
      if (iVar6 == 0) {
        bVar17 = false;
        pcVar7 = curl_maprintf("Host:%s\r\n",pcVar7 + 5);
        (data->state).aptr.host = pcVar7;
        if (pcVar7 == (char *)0x0) goto LAB_0013546b;
      }
    }
    CVar5 = CURLE_OK;
    bVar17 = true;
  }
LAB_0013546b:
  if (!bVar17) goto LAB_00135a52;
  pcVar7 = Curl_checkheaders(data,"User-Agent",10);
  if (pcVar7 != (char *)0x0) {
    (*Curl_cfree)((data->state).aptr.uagent);
    (data->state).aptr.uagent = (char *)0x0;
  }
  Curl_http_method(data,conn,&request,&httpreq);
  CVar5 = CURLE_OK;
  if ((data->state).up.query == (char *)0x0) {
    pcVar7 = (char *)0x0;
LAB_001354f3:
    pcVar8 = pcVar7;
    if (pcVar7 == (char *)0x0) {
      pcVar8 = (data->state).up.path;
    }
    CVar5 = Curl_http_output_auth(data,conn,request,httpreq,pcVar8,false);
    (*Curl_cfree)(pcVar7);
    cVar2 = (CVar5 != CURLE_OK) * '\x05';
  }
  else {
    pcVar7 = curl_maprintf("%s?%s",(data->state).up.path);
    if (pcVar7 != (char *)0x0) goto LAB_001354f3;
    cVar2 = '\x01';
  }
  if (cVar2 == '\x05') goto LAB_00135a52;
  if (cVar2 != '\0') {
    return CURLE_OUT_OF_MEMORY;
  }
  (*Curl_cfree)((data->state).aptr.ref);
  (data->state).aptr.ref = (char *)0x0;
  if (((data->state).referer != (char *)0x0) &&
     (pcVar7 = Curl_checkheaders(data,"Referer",7), pcVar7 == (char *)0x0)) {
    pcVar7 = curl_maprintf("Referer: %s\r\n",(data->state).referer);
    (data->state).aptr.ref = pcVar7;
    if (pcVar7 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  pcVar7 = Curl_checkheaders(data,"Accept-Encoding",0xf);
  if ((pcVar7 == (char *)0x0) && ((data->set).str[0x21] != (char *)0x0)) {
    (*Curl_cfree)((data->state).aptr.accept_encoding);
    pcVar7 = curl_maprintf("Accept-Encoding: %s\r\n",(data->set).str[0x21]);
    (data->state).aptr.accept_encoding = pcVar7;
    if (pcVar7 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    (*Curl_cfree)((data->state).aptr.accept_encoding);
    (data->state).aptr.accept_encoding = (char *)0x0;
  }
  pcVar7 = Curl_checkheaders(data,"TE",2);
  if ((pcVar7 == (char *)0x0) && (((data->set).field_0x89f & 1) != 0)) {
    pcVar7 = Curl_checkheaders(data,"Connection",10);
    (*Curl_cfree)((data->state).aptr.te);
    (data->state).aptr.te = (char *)0x0;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)0x0;
LAB_001356a1:
      pcVar8 = "";
      if (pcVar7 == (char *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar8 = ", ";
        pcVar12 = pcVar7;
        if (*pcVar7 == '\0') {
          pcVar8 = "";
        }
      }
      bVar17 = false;
      pcVar8 = curl_maprintf("Connection: %s%sTE\r\nTE: gzip\r\n",pcVar12,pcVar8);
      (data->state).aptr.te = pcVar8;
      (*Curl_cfree)(pcVar7);
      if ((data->state).aptr.te != (char *)0x0) goto LAB_001356f6;
      CVar5 = CURLE_OUT_OF_MEMORY;
    }
    else {
      pcVar7 = Curl_copy_header_value(in_stack_ffffffffffffff48);
      if (pcVar7 != (char *)0x0) goto LAB_001356a1;
      CVar5 = CURLE_OUT_OF_MEMORY;
      bVar17 = false;
    }
  }
  else {
LAB_001356f6:
    CVar5 = CURLE_OK;
    bVar17 = true;
  }
  if (bVar17) {
    bVar3 = http_request_version(data);
    uVar11 = (uint)bVar3;
    if (bVar3 == 0xb) {
      local_a8 = "1.1";
    }
    else if (uVar11 == 0x1e) {
      local_a8 = "3";
    }
    else if (uVar11 == 0x14) {
      local_a8 = "2";
    }
    else {
      local_a8 = "1.0";
    }
    CVar5 = http_req_set_reader(data,httpreq,uVar11,&te);
    if (CVar5 == CURLE_OK) {
      local_9c = uVar11;
      pcVar7 = Curl_checkheaders(data,"Accept",6);
      CVar5 = http_range(data,httpreq);
      if (CVar5 == CURLE_OK) {
        local_a0 = httpreq;
        Curl_dyn_init(&req,0x100000);
        Curl_dyn_reset(&(data->state).headerb);
        CVar5 = Curl_dyn_addf(&req,"%s ",request);
        if (CVar5 == CURLE_OK) {
          CVar5 = http_target(data,conn,&req);
        }
        if (CVar5 == CURLE_OK) {
          if ((((ulong)conn->bits & 0x80) == 0) ||
             (pcVar8 = Curl_checkheaders(data,"Alt-Used",8), pcVar8 != (char *)0x0)) {
            local_38 = (char *)0x0;
          }
          else {
            local_38 = curl_maprintf("Alt-Used: %s:%d\r\n",(conn->conn_to_host).name,
                                     (ulong)(uint)conn->conn_to_port);
            if (local_38 == (char *)0x0) {
              Curl_dyn_free(&req);
              return CURLE_OUT_OF_MEMORY;
            }
          }
          pcVar8 = (data->state).aptr.host;
          if (pcVar8 == (char *)0x0) {
            pcVar8 = "";
          }
          pcVar12 = (data->state).aptr.proxyuserpwd;
          if (pcVar12 == (char *)0x0) {
            pcVar12 = "";
          }
          pcVar13 = (data->state).aptr.userpwd;
          if (pcVar13 == (char *)0x0) {
            pcVar13 = "";
          }
          pcVar15 = "";
          if (((data->state).field_0x7bf & 4) != 0) {
            pcVar14 = (data->state).aptr.rangeline;
            pcVar15 = "";
            if (pcVar14 != (char *)0x0) {
              pcVar15 = pcVar14;
            }
          }
          pcVar14 = (data->set).str[0x2b];
          local_40 = "";
          if ((pcVar14 != (char *)0x0) && (local_40 = "", *pcVar14 != '\0')) {
            pcVar14 = (data->state).aptr.uagent;
            local_40 = "";
            if (pcVar14 != (char *)0x0) {
              local_40 = pcVar14;
            }
          }
          local_48 = "Accept: */*\r\n";
          if (pcVar7 != (char *)0x0) {
            local_48 = "";
          }
          local_50 = (data->state).aptr.te;
          if (local_50 == (char *)0x0) {
            local_50 = "";
          }
          pcVar7 = (data->set).str[0x21];
          local_58 = "";
          if ((pcVar7 != (char *)0x0) && (local_58 = "", *pcVar7 != '\0')) {
            pcVar7 = (data->state).aptr.accept_encoding;
            local_58 = "";
            if (pcVar7 != (char *)0x0) {
              local_58 = pcVar7;
            }
          }
          pcVar7 = "";
          if ((data->state).referer != (char *)0x0) {
            pcVar14 = (data->state).aptr.ref;
            pcVar7 = "";
            if (pcVar14 != (char *)0x0) {
              pcVar7 = pcVar14;
            }
          }
          pcVar14 = "";
          if (((ulong)conn->bits & 9) == 1) {
            pcVar10 = Curl_checkheaders(data,"Proxy-Connection",0x10);
            pcVar14 = "";
            if (pcVar10 == (char *)0x0) {
              pcVar10 = Curl_checkProxyheaders(data,conn,"Proxy-Connection",0x10);
              pcVar14 = "";
              if (pcVar10 == (char *)0x0) {
                pcVar14 = "Proxy-Connection: Keep-Alive\r\n";
              }
            }
          }
          pcVar10 = local_38;
          pcVar16 = "";
          if (local_38 != (char *)0x0) {
            pcVar16 = local_38;
          }
          CVar5 = Curl_dyn_addf(&req," HTTP/%s\r\n%s%s%s%s%s%s%s%s%s%s%s%s",local_a8,pcVar8,pcVar12,
                                pcVar13,pcVar15,local_40,local_48,local_50,local_58,pcVar7,pcVar14,
                                te,pcVar16);
          (*Curl_cfree)((data->state).aptr.userpwd);
          (data->state).aptr.userpwd = (char *)0x0;
          (*Curl_cfree)((data->state).aptr.proxyuserpwd);
          (data->state).aptr.proxyuserpwd = (char *)0x0;
          (*Curl_cfree)(pcVar10);
          if (CVar5 == CURLE_OK) {
            _Var4 = Curl_conn_is_ssl(conn,0);
            uVar11 = local_9c;
            bVar3 = (byte)local_9c;
            if ((((bVar3 < 0x14) && (!_Var4)) && (((data->state).http_neg.wanted & 2) != 0)) &&
               (((data->state).http_neg.field_0x3 & 1) != 0)) {
              Curl_dyn_free(&req);
              return CURLE_UNSUPPORTED_PROTOCOL;
            }
            CVar5 = http_cookies(data,conn,&req);
            if ((CVar5 == CURLE_OK) && (CVar5 = CURLE_OK, 0x3fffffff < conn->handler->protocol)) {
              CVar5 = Curl_ws_request(data,&req);
            }
            if (CVar5 == CURLE_OK) {
              CVar5 = Curl_add_timecondition(data,&req);
            }
            if (CVar5 == CURLE_OK) {
              CVar5 = Curl_add_custom_headers(data,false,uVar11,&req);
            }
            if ((CVar5 == CURLE_OK) &&
               (CVar5 = http_req_complete(data,&req,uVar11,local_a0), CVar5 == CURLE_OK)) {
              CVar5 = Curl_req_send(data,&req,bVar3);
            }
            Curl_dyn_free(&req);
            if ((0x13 < bVar3) && (CVar5 == CURLE_OK)) {
              uVar11 = *(uint *)&(data->req).field_0xd1;
              CVar5 = CURLE_OK;
              if ((short)uVar11 < 0) {
                *(uint *)&(data->req).field_0xd1 = uVar11 & 0xffff7fff;
              }
            }
            goto LAB_00135a52;
          }
        }
        Curl_dyn_free(&req);
      }
    }
  }
LAB_00135a52:
  if (CVar5 == CURLE_TOO_LARGE) {
    Curl_failf(data,"HTTP request too large");
  }
  return CVar5;
}

Assistant:

CURLcode Curl_http(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  Curl_HttpReq httpreq;
  const char *te = ""; /* transfer-encoding */
  const char *request;
  const char *httpstring;
  struct dynbuf req;
  char *altused = NULL;
  const char *p_accept;      /* Accept: string */
  unsigned char httpversion;

  /* Always consider the DO phase done after this function call, even if there
     may be parts of the request that are not yet sent, since we can deal with
     the rest of the request in the PERFORM phase. */
  *done = TRUE;

  switch(conn->alpn) {
  case CURL_HTTP_VERSION_3:
    DEBUGASSERT(Curl_conn_http_version(data, conn) == 30);
    break;
  case CURL_HTTP_VERSION_2:
#ifndef CURL_DISABLE_PROXY
    if((Curl_conn_http_version(data, conn) != 20) &&
       conn->bits.proxy && !conn->bits.tunnel_proxy
      ) {
      result = Curl_http2_switch(data);
      if(result)
        goto fail;
    }
    else
#endif
      DEBUGASSERT(Curl_conn_http_version(data, conn) == 20);
    break;
  case CURL_HTTP_VERSION_1_1:
    /* continue with HTTP/1.x when explicitly requested */
    break;
  default:
    /* Check if user wants to use HTTP/2 with clear TCP */
    if(Curl_http2_may_switch(data)) {
      DEBUGF(infof(data, "HTTP/2 over clean TCP"));
      result = Curl_http2_switch(data);
      if(result)
        goto fail;
    }
    break;
  }

  /* Add collecting of headers written to client. For a new connection,
   * we might have done that already, but reuse
   * or multiplex needs it here as well. */
  result = Curl_headers_init(data);
  if(result)
    goto fail;

  result = http_host(data, conn);
  if(result)
    goto fail;

  result = http_useragent(data);
  if(result)
    goto fail;

  Curl_http_method(data, conn, &request, &httpreq);

  /* setup the authentication headers */
  {
    char *pq = NULL;
    if(data->state.up.query) {
      pq = aprintf("%s?%s", data->state.up.path, data->state.up.query);
      if(!pq)
        return CURLE_OUT_OF_MEMORY;
    }
    result = Curl_http_output_auth(data, conn, request, httpreq,
                                   (pq ? pq : data->state.up.path), FALSE);
    free(pq);
    if(result)
      goto fail;
  }

  Curl_safefree(data->state.aptr.ref);
  if(data->state.referer && !Curl_checkheaders(data, STRCONST("Referer"))) {
    data->state.aptr.ref = aprintf("Referer: %s\r\n", data->state.referer);
    if(!data->state.aptr.ref)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!Curl_checkheaders(data, STRCONST("Accept-Encoding")) &&
     data->set.str[STRING_ENCODING]) {
    free(data->state.aptr.accept_encoding);
    data->state.aptr.accept_encoding =
      aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);
    if(!data->state.aptr.accept_encoding)
      return CURLE_OUT_OF_MEMORY;
  }
  else
    Curl_safefree(data->state.aptr.accept_encoding);

#ifdef HAVE_LIBZ
  /* we only consider transfer-encoding magic if libz support is built-in */
  result = http_transferencode(data);
  if(result)
    goto fail;
#endif

  httpversion = http_request_version(data);
  httpstring = get_http_string(httpversion);

  result = http_req_set_reader(data, httpreq, httpversion, &te);
  if(result)
    goto fail;

  p_accept = Curl_checkheaders(data,
                               STRCONST("Accept")) ? NULL : "Accept: */*\r\n";

  result = http_range(data, httpreq);
  if(result)
    goto fail;

  /* initialize a dynamic send-buffer */
  Curl_dyn_init(&req, DYN_HTTP_REQUEST);

  /* make sure the header buffer is reset - if there are leftovers from a
     previous transfer */
  Curl_dyn_reset(&data->state.headerb);

  /* add the main request stuff */
  /* GET/HEAD/POST/PUT */
  result = Curl_dyn_addf(&req, "%s ", request);
  if(!result)
    result = http_target(data, conn, &req);
  if(result) {
    Curl_dyn_free(&req);
    goto fail;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(conn->bits.altused && !Curl_checkheaders(data, STRCONST("Alt-Used"))) {
    altused = aprintf("Alt-Used: %s:%d\r\n",
                      conn->conn_to_host.name, conn->conn_to_port);
    if(!altused) {
      Curl_dyn_free(&req);
      return CURLE_OUT_OF_MEMORY;
    }
  }
#endif
  result =
    Curl_dyn_addf(&req,
                  " HTTP/%s\r\n" /* HTTP version */
                  "%s" /* host */
                  "%s" /* proxyuserpwd */
                  "%s" /* userpwd */
                  "%s" /* range */
                  "%s" /* user agent */
                  "%s" /* accept */
                  "%s" /* TE: */
                  "%s" /* accept-encoding */
                  "%s" /* referer */
                  "%s" /* Proxy-Connection */
                  "%s" /* transfer-encoding */
                  "%s",/* Alt-Used */

                  httpstring,
                  (data->state.aptr.host ? data->state.aptr.host : ""),
#ifndef CURL_DISABLE_PROXY
                  data->state.aptr.proxyuserpwd ?
                  data->state.aptr.proxyuserpwd : "",
#else
                  "",
#endif
                  data->state.aptr.userpwd ? data->state.aptr.userpwd : "",
                  (data->state.use_range && data->state.aptr.rangeline) ?
                  data->state.aptr.rangeline : "",
                  (data->set.str[STRING_USERAGENT] &&
                   *data->set.str[STRING_USERAGENT] &&
                   data->state.aptr.uagent) ?
                  data->state.aptr.uagent : "",
                  p_accept ? p_accept : "",
                  data->state.aptr.te ? data->state.aptr.te : "",
                  (data->set.str[STRING_ENCODING] &&
                   *data->set.str[STRING_ENCODING] &&
                   data->state.aptr.accept_encoding) ?
                  data->state.aptr.accept_encoding : "",
                  (data->state.referer && data->state.aptr.ref) ?
                  data->state.aptr.ref : "" /* Referer: <data> */,
#ifndef CURL_DISABLE_PROXY
                  (conn->bits.httpproxy &&
                   !conn->bits.tunnel_proxy &&
                   !Curl_checkheaders(data, STRCONST("Proxy-Connection")) &&
                   !Curl_checkProxyheaders(data, conn,
                                           STRCONST("Proxy-Connection"))) ?
                  "Proxy-Connection: Keep-Alive\r\n":"",
#else
                  "",
#endif
                  te,
                  altused ? altused : ""
      );

  /* clear userpwd and proxyuserpwd to avoid reusing old credentials
   * from reused connections */
  Curl_safefree(data->state.aptr.userpwd);
#ifndef CURL_DISABLE_PROXY
  Curl_safefree(data->state.aptr.proxyuserpwd);
#endif
  free(altused);

  if(result) {
    Curl_dyn_free(&req);
    goto fail;
  }

  if(!Curl_conn_is_ssl(conn, FIRSTSOCKET) && (httpversion < 20) &&
     (data->state.http_neg.wanted & CURL_HTTP_V2x) &&
     data->state.http_neg.h2_upgrade) {
    /* append HTTP2 upgrade magic stuff to the HTTP request if it is not done
       over SSL */
    result = Curl_http2_request_upgrade(&req, data);
    if(result) {
      Curl_dyn_free(&req);
      return result;
    }
  }

  result = http_cookies(data, conn, &req);
#ifndef CURL_DISABLE_WEBSOCKETS
  if(!result && conn->handler->protocol&(CURLPROTO_WS|CURLPROTO_WSS))
    result = Curl_ws_request(data, &req);
#endif
  if(!result)
    result = Curl_add_timecondition(data, &req);
  if(!result)
    result = Curl_add_custom_headers(data, FALSE, httpversion, &req);

  if(!result) {
    /* req_send takes ownership of the 'req' memory on success */
    result = http_req_complete(data, &req, httpversion, httpreq);
    if(!result)
      result = Curl_req_send(data, &req, httpversion);
  }
  Curl_dyn_free(&req);
  if(result)
    goto fail;

  if((httpversion >= 20) && data->req.upload_chunky)
    /* upload_chunky was set above to set up the request in a chunky fashion,
       but is disabled here again to avoid that the chunked encoded version is
       actually used when sending the request body over h2 */
    data->req.upload_chunky = FALSE;
fail:
  if(CURLE_TOO_LARGE == result)
    failf(data, "HTTP request too large");
  return result;
}